

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

_Bool container_contains(container_t *c,uint16_t val,uint8_t typecode)

{
  ushort uVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  ulong uVar5;
  _Bool _Var6;
  ulong uVar7;
  int iVar8;
  undefined7 in_register_00000011;
  long lVar9;
  uint uVar10;
  uint uVar11;
  
  uVar7 = CONCAT71(in_register_00000011,typecode);
  if ((int)uVar7 == 4) {
    uVar7 = CONCAT71(in_register_00000011,*(undefined1 *)((long)c + 8));
    c = *c;
  }
  lVar2 = *(long *)((long)c + 8);
  if ((char)uVar7 == '\x03') {
    iVar8 = *c + -1;
    uVar10 = 0;
    do {
      if (iVar8 < (int)uVar10) {
        uVar11 = ~uVar10;
        break;
      }
      uVar11 = uVar10 + iVar8 >> 1;
      uVar1 = *(ushort *)(lVar2 + (ulong)uVar11 * 4);
      if (uVar1 < val) {
        uVar10 = uVar11 + 1;
        bVar4 = true;
      }
      else if (val < uVar1) {
        iVar8 = uVar11 - 1;
        bVar4 = true;
      }
      else {
        bVar4 = false;
        uVar7 = (ulong)uVar11;
      }
      uVar11 = (uint)uVar7;
    } while (bVar4);
    if ((int)uVar11 < 0) {
      if (uVar11 == 0xffffffff) {
        return false;
      }
      if ((int)(uint)*(ushort *)(lVar2 + 2 + (ulong)(-uVar11 - 2) * 4) <
          (int)((uint)val - (uint)*(ushort *)(lVar2 + (ulong)(-uVar11 - 2) * 4))) {
        return false;
      }
    }
  }
  else {
    if (((uint)uVar7 & 0xff) != 2) {
      return (*(ulong *)(lVar2 + (ulong)(val >> 6) * 8) >> ((ulong)val & 0x3f) & 1) != 0;
    }
    iVar8 = *c + -1;
    uVar7 = 0;
    do {
      iVar3 = (int)uVar7;
      if (iVar8 < iVar3 + 0x10) {
        if (iVar8 < iVar3) {
          return false;
        }
        _Var6 = true;
        lVar9 = 0;
        do {
          uVar1 = *(ushort *)(lVar2 + uVar7 * 2 + lVar9 * 2);
          _Var6 = (_Bool)(_Var6 & uVar1 <= val | uVar1 == val);
          if (val <= uVar1) {
            return _Var6;
          }
          lVar9 = lVar9 + 1;
        } while ((iVar8 - iVar3) + 1 != (int)lVar9);
        return false;
      }
      uVar10 = (uint)(iVar3 + iVar8) >> 1;
      uVar1 = *(ushort *)(lVar2 + (ulong)(iVar3 + iVar8 & 0xfffffffe));
      iVar3 = uVar10 - 1;
      if (uVar1 <= val) {
        iVar3 = iVar8;
      }
      uVar5 = (ulong)(uVar10 + 1);
      if (val <= uVar1) {
        uVar5 = uVar7;
        iVar8 = iVar3;
      }
      uVar7 = uVar5;
    } while (uVar1 != val);
  }
  return true;
}

Assistant:

static inline const container_t *container_unwrap_shared(
    const container_t *candidate_shared_container, uint8_t *type) {
    if (*type == SHARED_CONTAINER_TYPE) {
        *type = const_CAST_shared(candidate_shared_container)->typecode;
        assert(*type != SHARED_CONTAINER_TYPE);
        return const_CAST_shared(candidate_shared_container)->container;
    } else {
        return candidate_shared_container;
    }
}